

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O1

bool Jupiter_isBase64_s(char *in,size_t inLen)

{
  char *pcVar1;
  size_t sVar2;
  
  if ((inLen & 3) == 0) {
    sVar2 = 0;
    do {
      if (inLen == sVar2) {
        return inLen == sVar2;
      }
      pcVar1 = in + sVar2;
      sVar2 = sVar2 + 1;
    } while ("BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[*pcVar1] != 'B');
  }
  return false;
}

Assistant:

bool Jupiter_isBase64_s(const char *in, size_t inLen)
{
	if (inLen % 4 != 0)
	{
		return false;
	}
	const char *end = in + inLen;
	while (in != end)
	{
		switch (Jupiter_base64DecodeTable[*in++])
		{
		case 66:
			return false;
		default:
			break;
		}
	}
	return true;
}